

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

int Gia_MuxRef_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  int iVar3;
  
  iVar3 = 0;
  while ((p->pMuxes != (uint *)0x0 && (p->pMuxes[iObj] != 0))) {
    pObj = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjRefInc(p,pObj);
    if (iVar1 != 0) {
      return iVar3;
    }
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    iVar1 = Gia_MuxRef_rec(p,iVar1);
    iVar2 = Gia_ObjFaninId1p(p,pObj);
    iVar2 = Gia_MuxRef_rec(p,iVar2);
    iObj = Gia_ObjFaninId2p(p,pObj);
    iVar3 = iVar3 + iVar2 + iVar1 + 1;
  }
  return iVar3;
}

Assistant:

int Gia_MuxRef_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( !Gia_ObjIsMuxId(p, iObj) )
        return 0;
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjRefInc(p, pObj) )
        return 0;
    return Gia_MuxRef_rec( p, Gia_ObjFaninId0p(p, pObj) ) + 
           Gia_MuxRef_rec( p, Gia_ObjFaninId1p(p, pObj) ) + 
           Gia_MuxRef_rec( p, Gia_ObjFaninId2p(p, pObj) ) + 1;
}